

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2OrderParameter.cpp
# Opt level: O0

void __thiscall OpenMD::P2OrderParameter::writeP2(P2OrderParameter *this)

{
  char *pcVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  double *pdVar5;
  StaticAnalyser *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_t i;
  Vector3d directorSum;
  RealType angleSum;
  RealType p2Sum;
  ofstream os;
  Vector<double,_3U> *in_stack_fffffffffffffcc8;
  Vector<double,_3U> *in_stack_fffffffffffffcd0;
  ulong local_268;
  double local_260;
  Vector<double,_3U> local_258;
  Vector<double,_3U> local_240;
  double local_228;
  double local_220;
  ostream local_208 [520];
  
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar1,_S_out);
  std::operator<<(local_208,"#P2 Order parameter\n");
  poVar2 = std::operator<<(local_208,"#selection1: (");
  poVar2 = std::operator<<(poVar2,(string *)&in_RDI[1].dumpFilename_);
  std::operator<<(poVar2,")\t");
  if (((ulong)in_RDI[1].info_ & 1) == 0) {
    poVar2 = std::operator<<(local_208,"selection2: (");
    poVar2 = std::operator<<(poVar2,(string *)&in_RDI[1].step_);
    std::operator<<(poVar2,")\n");
  }
  std::operator<<(local_208,"#p2\tdirector_x\tdirector_y\tdirector_z\tangle(degree)\n");
  local_220 = 0.0;
  local_228 = 0.0;
  local_260 = 0.0;
  Vector<double,_3U>::Vector(&local_258,&local_260);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_268 = 0;
  while( true ) {
    sVar3 = std::
            vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
            ::size((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                    *)&in_RDI[0x11].info_);
    if (sVar3 <= local_268) break;
    pvVar4 = std::
             vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
             ::operator[]((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                           *)&in_RDI[0x11].info_,local_268);
    local_220 = local_220 + pvVar4->p2;
    std::
    vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
    ::operator[]((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                  *)&in_RDI[0x11].info_,local_268);
    Vector<double,_3U>::operator+=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    pvVar4 = std::
             vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
             ::operator[]((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                           *)&in_RDI[0x11].info_,local_268);
    local_228 = pvVar4->angle + local_228;
    local_268 = local_268 + 1;
  }
  sVar3 = std::
          vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
          ::size((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                  *)&in_RDI[0x11].info_);
  auVar6._8_4_ = (int)(sVar3 >> 0x20);
  auVar6._0_8_ = sVar3;
  auVar6._12_4_ = 0x45300000;
  local_220 = local_220 /
              ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
  std::
  vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ::size((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
          *)&in_RDI[0x11].info_);
  Vector<double,_3U>::operator/=(in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8);
  sVar3 = std::
          vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
          ::size((vector<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                  *)&in_RDI[0x11].info_);
  auVar7._8_4_ = (int)(sVar3 >> 0x20);
  auVar7._0_8_ = sVar3;
  auVar7._12_4_ = 0x45300000;
  local_228 = local_228 /
              ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
  poVar2 = (ostream *)std::ostream::operator<<(local_208,local_220);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar5 = Vector<double,_3U>::operator[](&local_240,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar5);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar5 = Vector<double,_3U>::operator[](&local_240,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar5);
  poVar2 = std::operator<<(poVar2,"\t");
  pdVar5 = Vector<double,_3U>::operator[](&local_240,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar5);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_228);
  std::operator<<(poVar2,"\n");
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void P2OrderParameter::writeP2() {
    ofstream os(getOutputFileName().c_str());
    os << "#P2 Order parameter\n";
    os << "#selection1: (" << selectionScript1_ << ")\t";
    if (!doVect_) { os << "selection2: (" << selectionScript2_ << ")\n"; }
    os << "#p2\tdirector_x\tdirector_y\tdirector_z\tangle(degree)\n";

    RealType p2Sum {};
    RealType angleSum {};
    Vector3d directorSum(0.0);

    for (size_t i = 0; i < orderParams_.size(); ++i) {
      p2Sum += orderParams_[i].p2;
      directorSum += orderParams_[i].director;
      angleSum += orderParams_[i].angle;
    }

    p2Sum /= orderParams_.size();
    directorSum /= orderParams_.size();
    angleSum /= orderParams_.size();

    os << p2Sum << "\t" << directorSum[0] << "\t" << directorSum[1] << "\t"
       << directorSum[2] << "\t" << angleSum << "\n";
  }